

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

int __thiscall ONX_Model::AddDefaultLayer(ONX_Model *this,wchar_t *layer_name,ON_Color layer_color)

{
  ON_3dmSettings *this_00;
  bool bVar1;
  Type TVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ON_Layer *pOVar8;
  wchar_t *component_name;
  ON_UUID *pOVar9;
  int iVar10;
  ON_UUID layer_model_id;
  uint in_stack_fffffffffffffe7c;
  int local_16c;
  ON_Color layer_color_local;
  ON_ModelComponentReference mcr;
  ON_UUID default_layer_id;
  ON_ModelComponentReference mr;
  ON_Layer default_layer;
  
  this_00 = &this->m_settings;
  layer_color_local = layer_color;
  default_layer_id = ON_3dmSettings::CurrentLayerId(this_00);
  iVar4 = ON_3dmSettings::CurrentLayerIndex(this_00);
  iVar10 = 0;
  do {
    if (iVar10 == 0) {
      bVar1 = ::operator==(&ON_nil_uuid,&default_layer_id);
      if (!bVar1) {
        layer_model_id.Data4 = (uchar  [8])default_layer_id._0_8_;
        layer_model_id._0_8_ = this;
        LayerFromId((ONX_Model *)&mcr,layer_model_id);
        goto LAB_00483abc;
      }
    }
    else {
      if (iVar10 == 2) {
        iVar4 = AddLayer(this,layer_name,layer_color_local);
        if (-1 < iVar4) {
          LayerFromIndex((ONX_Model *)&default_layer,(int)this);
          pOVar8 = ON_Layer::FromModelComponentRef
                             ((ON_ModelComponentReference *)&default_layer,(ON_Layer *)0x0);
          bVar1 = true;
          if (((pOVar8 != (ON_Layer *)0x0) &&
              (iVar4 = ON_ModelComponent::Index(&pOVar8->super_ON_ModelComponent), -1 < iVar4)) &&
             (bVar3 = ON_ModelComponent::IsSystemComponent(&pOVar8->super_ON_ModelComponent), !bVar3
             )) {
            pOVar9 = ON_ModelComponent::Id(&pOVar8->super_ON_ModelComponent);
            ON_3dmSettings::SetCurrentLayerId(this_00,*pOVar9);
            local_16c = ON_ModelComponent::Index(&pOVar8->super_ON_ModelComponent);
            bVar1 = false;
          }
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)&default_layer);
          if (!bVar1) {
            return local_16c;
          }
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                   ,0x4f2,"","Failed to add default layer.");
        return -0x7fffffff;
      }
      if (iVar4 != -0x7fffffff) {
        LayerFromIndex((ONX_Model *)&mcr,(int)this);
LAB_00483abc:
        pOVar8 = ON_Layer::FromModelComponentRef(&mcr,(ON_Layer *)0x0);
        if (pOVar8 == (ON_Layer *)0x0) {
          ON_ModelComponentReference::~ON_ModelComponentReference(&mcr);
        }
        else {
          bVar1 = ON_ModelComponent::IsSystemComponent(&pOVar8->super_ON_ModelComponent);
          if (((!bVar1) &&
              (iVar5 = ON_ModelComponent::Index(&pOVar8->super_ON_ModelComponent), -1 < iVar5)) &&
             ((bVar1 = ON_ModelComponent::ParentIdIsNil(&pOVar8->super_ON_ModelComponent), bVar1 &&
              ((bVar1 = ON_Layer::IsVisible(pOVar8), bVar1 &&
               (bVar1 = ON_ModelComponent::IsLocked(&pOVar8->super_ON_ModelComponent), !bVar1))))))
          {
            pOVar9 = ON_ModelComponent::Id(&pOVar8->super_ON_ModelComponent);
            ON_3dmSettings::SetCurrentLayerId(this_00,*pOVar9);
            iVar4 = ON_ModelComponent::Index(&pOVar8->super_ON_ModelComponent);
            ON_ModelComponentReference::~ON_ModelComponentReference(&mcr);
            return iVar4;
          }
          ON_Layer::ON_Layer(&default_layer,pOVar8);
          ON_ModelComponent::ClearId(&default_layer.super_ON_ModelComponent);
          ON_ModelComponent::ClearIndex(&default_layer.super_ON_ModelComponent);
          ON_ModelComponent::ClearParentId(&default_layer.super_ON_ModelComponent);
          ON_Layer::SetVisible(&default_layer,true);
          ON_Layer::SetLocked(&default_layer,false);
          if ((layer_name == (wchar_t *)0x0) || (*layer_name == L'\0')) {
            layer_name = ON_ModelComponent::NameAsPointer(&pOVar8->super_ON_ModelComponent);
          }
          TVar2 = ON_ModelComponent::ComponentType(&default_layer.super_ON_ModelComponent);
          ON_ComponentManifest::UnusedName
                    ((ON_ComponentManifest *)&mr,(char)this - 0x30,(ON_UUID)ZEXT116(TVar2),
                     (wchar_t *)(uchar  [8])0x0,layer_name,(wchar_t *)0x0,0,
                     (uint *)((ulong)in_stack_fffffffffffffe7c << 0x20));
          component_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&mr);
          ON_ModelComponent::SetName(&default_layer.super_ON_ModelComponent,component_name);
          ON_wString::~ON_wString((ON_wString *)&mr);
          uVar6 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
          uVar7 = ON_Color::operator_cast_to_unsigned_int(&layer_color_local);
          if (uVar6 != uVar7) {
            ON_Layer::SetColor(&default_layer,layer_color_local);
          }
          AddModelComponent((ONX_Model *)&mr,(ON_ModelComponent *)this,SUB81(&default_layer,0));
          pOVar8 = ON_Layer::FromModelComponentRef(&mr,(ON_Layer *)0x0);
          bVar1 = true;
          if (((pOVar8 != (ON_Layer *)0x0) &&
              (iVar5 = ON_ModelComponent::Index(&pOVar8->super_ON_ModelComponent), -1 < iVar5)) &&
             (bVar3 = ON_ModelComponent::IsSystemComponent(&pOVar8->super_ON_ModelComponent), !bVar3
             )) {
            pOVar9 = ON_ModelComponent::Id(&pOVar8->super_ON_ModelComponent);
            ON_3dmSettings::SetCurrentLayerId(this_00,*pOVar9);
            local_16c = ON_ModelComponent::Index(&pOVar8->super_ON_ModelComponent);
            bVar1 = false;
          }
          ON_ModelComponentReference::~ON_ModelComponentReference(&mr);
          ON_Layer::~ON_Layer(&default_layer);
          ON_ModelComponentReference::~ON_ModelComponentReference(&mcr);
          if (!bVar1) {
            return local_16c;
          }
        }
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int ONX_Model::AddDefaultLayer(
  const wchar_t* layer_name,
  ON_Color layer_color
)
{
  ON_UUID default_layer_id = m_settings.CurrentLayerId();
  int default_layer_index = m_settings.CurrentLayerIndex();
  for ( int pass = 0; pass < 2; pass++ )
  {
    if (0 == pass)
    {
      if (ON_nil_uuid == default_layer_id)
        continue;
    }
    else 
    {
      if (ON_UNSET_INT_INDEX == default_layer_index)
        continue;
    }
    ON_ModelComponentReference mcr
      = (0 == pass)
      ? LayerFromId(default_layer_id)
      : LayerFromIndex(default_layer_index);

    const ON_Layer* layer = ON_Layer::FromModelComponentRef(mcr, nullptr);
    if (nullptr == layer)
      continue;
    if (false == layer->IsSystemComponent() && layer->Index() >= 0 && layer->ParentIdIsNil() && layer->IsVisible() && false == layer->IsLocked() )
    {
      m_settings.SetCurrentLayerId(layer->Id());
      return layer->Index();
    }
    ON_Layer default_layer(*layer);
    default_layer.ClearId();
    default_layer.ClearIndex();
    default_layer.ClearParentId();
    default_layer.SetVisible(true);
    default_layer.SetLocked(false);

    if (nullptr == layer_name || 0 == layer_name[0])
      layer_name = layer->NameAsPointer();
    default_layer.SetName(m_manifest.UnusedName(default_layer.ComponentType(), ON_nil_uuid, layer_name, nullptr, nullptr, 0, nullptr) );

    if (ON_Color::UnsetColor != layer_color)
      default_layer.SetColor(layer_color);

    const ON_ModelComponentReference mr = AddModelComponent(default_layer, true);
    const ON_Layer* managed_layer = ON_Layer::FromModelComponentRef(mr, nullptr);
    if (nullptr != managed_layer && managed_layer->Index() >= 0 && false == managed_layer->IsSystemComponent())
    {
      m_settings.SetCurrentLayerId(managed_layer->Id());
      return managed_layer->Index();
    }
  }

  int layer_index = AddLayer(layer_name, layer_color);
  if (layer_index >= 0)
  {
    const ON_ModelComponentReference mr = LayerFromIndex(layer_index);
    const ON_Layer* managed_layer = ON_Layer::FromModelComponentRef(mr, nullptr);
    if (nullptr != managed_layer && managed_layer->Index() >= 0 && false == managed_layer->IsSystemComponent())
    {
      m_settings.SetCurrentLayerId(managed_layer->Id());
      return managed_layer->Index();
    }
  }

  ON_ERROR("Failed to add default layer.");
  return ON_UNSET_INT_INDEX;  
}